

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_app.cpp
# Opt level: O0

bool __thiscall Clasp::Cli::ClaspAppBase::onSignal(ClaspAppBase *this,int sig)

{
  bool bVar1;
  int __status;
  ClaspFacade *pCVar2;
  Application *in_RDI;
  double dVar3;
  int unaff_retaddr;
  undefined4 in_stack_00000008;
  
  pCVar2 = SingleOwnerPtr<Clasp::ClaspFacade,_Clasp::DeleteObject>::get
                     ((SingleOwnerPtr<Clasp::ClaspFacade,_Clasp::DeleteObject> *)0x1171a2);
  if (pCVar2 != (ClaspFacade *)0x0) {
    SingleOwnerPtr<Clasp::ClaspFacade,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Clasp::ClaspFacade,_Clasp::DeleteObject> *)0x1171b8);
    bVar1 = ClaspFacade::interrupt((ClaspFacade *)CONCAT44(sig,in_stack_00000008),unaff_retaddr);
    if (bVar1) {
      dVar3 = RealTime::getTime();
      shutdownTime_g = -dVar3;
      (*in_RDI->_vptr_Application[7])(in_RDI,"Sending shutdown signal...");
      return false;
    }
  }
  (*in_RDI->_vptr_Application[7])(in_RDI,"INTERRUPTED by signal!");
  Potassco::Application::setExitCode(in_RDI,1);
  (*in_RDI->_vptr_Application[0x10])();
  __status = Potassco::Application::getExitCode(in_RDI);
  Potassco::Application::exit(in_RDI,__status);
  return false;
}

Assistant:

bool ClaspAppBase::onSignal(int sig) {
	if (!clasp_.get() || !clasp_->interrupt(sig)) {
		info("INTERRUPTED by signal!");
		setExitCode(E_INTERRUPT);
		shutdown();
		exit(getExitCode());
	}
	else {
		// multiple threads are active - shutdown was initiated
		shutdownTime_g = -RealTime::getTime();
		info("Sending shutdown signal...");
	}
	return false; // ignore all future signals
}